

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLUtil.cpp
# Opt level: O0

ByteString * OSSL::pt2ByteString(EC_POINT *pt,EC_GROUP *grp)

{
  size_t len_00;
  uchar *buf;
  EC_GROUP *in_RDX;
  ByteString *in_RSI;
  ByteString *in_RDI;
  ByteString *in_stack_00000028;
  size_t len;
  ByteString raw;
  size_t in_stack_ffffffffffffff78;
  ByteString *in_stack_ffffffffffffff80;
  ByteString *in_stack_ffffffffffffff88;
  ByteString *in_stack_ffffffffffffff90;
  
  ByteString::ByteString((ByteString *)0x1c3ec0);
  if ((in_RSI == (ByteString *)0x0) || (in_RDX == (EC_GROUP *)0x0)) {
    ByteString::ByteString(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  }
  else {
    len_00 = EC_POINT_point2oct(in_RDX,(EC_POINT *)in_RSI,POINT_CONVERSION_UNCOMPRESSED,(uchar *)0x0
                                ,0,(BN_CTX *)0x0);
    ByteString::resize(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    buf = ByteString::operator[](in_RSI,(size_t)in_RDX);
    EC_POINT_point2oct(in_RDX,(EC_POINT *)in_RSI,POINT_CONVERSION_UNCOMPRESSED,buf,len_00,
                       (BN_CTX *)0x0);
    DERUTIL::raw2Octet(in_stack_00000028);
  }
  ByteString::~ByteString((ByteString *)0x1c3fbb);
  return in_RDI;
}

Assistant:

ByteString OSSL::pt2ByteString(const EC_POINT* pt, const EC_GROUP* grp)
{
	ByteString raw;

	if (pt == NULL || grp == NULL)
		return raw;

	size_t len = EC_POINT_point2oct(grp, pt, POINT_CONVERSION_UNCOMPRESSED, NULL, 0, NULL);
	raw.resize(len);
	EC_POINT_point2oct(grp, pt, POINT_CONVERSION_UNCOMPRESSED, &raw[0], len, NULL);

	return DERUTIL::raw2Octet(raw);
}